

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Stress::VertexAttributeBindingTests::init
          (VertexAttributeBindingTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *node;
  TestNode *node_00;
  SingleBindingCase *pSVar1;
  BindVertexBufferCase *pBVar2;
  TestCaseGroup *bufferRangeGroup;
  TestCaseGroup *unalignedGroup;
  VertexAttributeBindingTests *this_local;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"unaligned",
             "Unaligned access");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "buffer_bounds","Source data over buffer bounds");
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  pSVar1 = (SingleBindingCase *)operator_new(0xa0);
  anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar1,(this->super_TestCaseGroup).m_context,"elements_1_unaligned",1);
  tcu::TestNode::addChild(node,(TestNode *)pSVar1);
  pSVar1 = (SingleBindingCase *)operator_new(0xa0);
  anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar1,(this->super_TestCaseGroup).m_context,"offset_elements_1_unaligned",0x11);
  tcu::TestNode::addChild(node,(TestNode *)pSVar1);
  pSVar1 = (SingleBindingCase *)operator_new(0xa0);
  anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar1,(this->super_TestCaseGroup).m_context,"unaligned_offset_elements_1",0x20);
  tcu::TestNode::addChild(node,(TestNode *)pSVar1);
  pSVar1 = (SingleBindingCase *)operator_new(0xa0);
  anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar1,(this->super_TestCaseGroup).m_context,"unaligned_offset_elements_1_unaligned",
             0x21);
  tcu::TestNode::addChild(node,(TestNode *)pSVar1);
  pSVar1 = (SingleBindingCase *)operator_new(0xa0);
  anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar1,(this->super_TestCaseGroup).m_context,"unaligned_offset_elements_2",0x24);
  tcu::TestNode::addChild(node,(TestNode *)pSVar1);
  pSVar1 = (SingleBindingCase *)operator_new(0xa0);
  anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar1,(this->super_TestCaseGroup).m_context,
             "unaligned_offset_elements_2_share_elements",0x28);
  tcu::TestNode::addChild(node,(TestNode *)pSVar1);
  pSVar1 = (SingleBindingCase *)operator_new(0xa0);
  anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar1,(this->super_TestCaseGroup).m_context,"unaligned_stride_elements_1",0x40);
  tcu::TestNode::addChild(node,(TestNode *)pSVar1);
  pSVar1 = (SingleBindingCase *)operator_new(0xa0);
  anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar1,(this->super_TestCaseGroup).m_context,"unaligned_stride_elements_2",0x44);
  tcu::TestNode::addChild(node,(TestNode *)pSVar1);
  pSVar1 = (SingleBindingCase *)operator_new(0xa0);
  anon_unknown_0::SingleBindingCase::SingleBindingCase
            (pSVar1,(this->super_TestCaseGroup).m_context,
             "unaligned_stride_elements_2_share_elements",0x48);
  tcu::TestNode::addChild(node,(TestNode *)pSVar1);
  pBVar2 = (BindVertexBufferCase *)operator_new(0x90);
  anon_unknown_0::BindVertexBufferCase::BindVertexBufferCase
            (pBVar2,(this->super_TestCaseGroup).m_context,"bind_vertex_buffer_offset_over_bounds_10"
             ,"Offset over buffer bounds",0x210000,10);
  tcu::TestNode::addChild(node_00,(TestNode *)pBVar2);
  pBVar2 = (BindVertexBufferCase *)operator_new(0x90);
  anon_unknown_0::BindVertexBufferCase::BindVertexBufferCase
            (pBVar2,(this->super_TestCaseGroup).m_context,
             "bind_vertex_buffer_offset_over_bounds_1000","Offset over buffer bounds",0x210000,1000)
  ;
  tcu::TestNode::addChild(node_00,(TestNode *)pBVar2);
  pBVar2 = (BindVertexBufferCase *)operator_new(0x90);
  anon_unknown_0::BindVertexBufferCase::BindVertexBufferCase
            (pBVar2,(this->super_TestCaseGroup).m_context,"bind_vertex_buffer_offset_near_wrap_10",
             "Offset over buffer bounds, near wrapping",0x7ffffff0,10);
  tcu::TestNode::addChild(node_00,(TestNode *)pBVar2);
  pBVar2 = (BindVertexBufferCase *)operator_new(0x90);
  anon_unknown_0::BindVertexBufferCase::BindVertexBufferCase
            (pBVar2,(this->super_TestCaseGroup).m_context,"bind_vertex_buffer_offset_near_wrap_1000"
             ,"Offset over buffer bounds, near wrapping",0x7ffffff0,1000);
  tcu::TestNode::addChild(node_00,(TestNode *)pBVar2);
  return extraout_EAX;
}

Assistant:

void VertexAttributeBindingTests::init (void)
{
	tcu::TestCaseGroup* const unalignedGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned",		"Unaligned access");
	tcu::TestCaseGroup* const bufferRangeGroup	= new tcu::TestCaseGroup(m_testCtx, "buffer_bounds",	"Source data over buffer bounds");

	addChild(unalignedGroup);
	addChild(bufferRangeGroup);

	// .unaligned
	{
		unalignedGroup->addChild(new SingleBindingCase(m_context, "elements_1_unaligned",																		  SingleBindingCase::FLAG_ATTRIB_UNALIGNED));
		unalignedGroup->addChild(new SingleBindingCase(m_context, "offset_elements_1_unaligned",				SingleBindingCase::FLAG_BUF_ALIGNED_OFFSET		| SingleBindingCase::FLAG_ATTRIB_UNALIGNED));

		unalignedGroup->addChild(new SingleBindingCase(m_context, "unaligned_offset_elements_1",				SingleBindingCase::FLAG_BUF_UNALIGNED_OFFSET	| 0));
		unalignedGroup->addChild(new SingleBindingCase(m_context, "unaligned_offset_elements_1_unaligned",		SingleBindingCase::FLAG_BUF_UNALIGNED_OFFSET	| SingleBindingCase::FLAG_ATTRIB_UNALIGNED));
		unalignedGroup->addChild(new SingleBindingCase(m_context, "unaligned_offset_elements_2",				SingleBindingCase::FLAG_BUF_UNALIGNED_OFFSET	| SingleBindingCase::FLAG_ATTRIBS_MULTIPLE_ELEMS));
		unalignedGroup->addChild(new SingleBindingCase(m_context, "unaligned_offset_elements_2_share_elements",	SingleBindingCase::FLAG_BUF_UNALIGNED_OFFSET	| SingleBindingCase::FLAG_ATTRIBS_SHARED_ELEMS));

		unalignedGroup->addChild(new SingleBindingCase(m_context, "unaligned_stride_elements_1",				SingleBindingCase::FLAG_BUF_UNALIGNED_STRIDE	| 0));
		unalignedGroup->addChild(new SingleBindingCase(m_context, "unaligned_stride_elements_2",				SingleBindingCase::FLAG_BUF_UNALIGNED_STRIDE	| SingleBindingCase::FLAG_ATTRIBS_MULTIPLE_ELEMS));
		unalignedGroup->addChild(new SingleBindingCase(m_context, "unaligned_stride_elements_2_share_elements",	SingleBindingCase::FLAG_BUF_UNALIGNED_STRIDE	| SingleBindingCase::FLAG_ATTRIBS_SHARED_ELEMS));
	}

	// .buffer_bounds
	{
		// bind buffer offset cases
		bufferRangeGroup->addChild(new BindVertexBufferCase(m_context, "bind_vertex_buffer_offset_over_bounds_10",		"Offset over buffer bounds",				0x00210000, 10));
		bufferRangeGroup->addChild(new BindVertexBufferCase(m_context, "bind_vertex_buffer_offset_over_bounds_1000",	"Offset over buffer bounds",				0x00210000, 1000));
		bufferRangeGroup->addChild(new BindVertexBufferCase(m_context, "bind_vertex_buffer_offset_near_wrap_10",		"Offset over buffer bounds, near wrapping",	0x7FFFFFF0, 10));
		bufferRangeGroup->addChild(new BindVertexBufferCase(m_context, "bind_vertex_buffer_offset_near_wrap_1000",		"Offset over buffer bounds, near wrapping",	0x7FFFFFF0, 1000));
	}
}